

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_299ed3::CliqueRunner::colour_class_order
          (CliqueRunner *this,SVOBitset *p,int *p_order,int *p_bounds,int *p_end)

{
  bool bVar1;
  uint a;
  int iVar2;
  SVOBitset p_left;
  SVOBitset q;
  SVOBitset local_140;
  SVOBitset local_b8;
  
  gss::innards::SVOBitset::SVOBitset(&local_140,p);
  *p_end = 0;
  iVar2 = 0;
  while( true ) {
    bVar1 = gss::innards::SVOBitset::any(&local_140);
    if (!bVar1) break;
    gss::innards::SVOBitset::SVOBitset(&local_b8,&local_140);
    iVar2 = iVar2 + 1;
    while( true ) {
      bVar1 = gss::innards::SVOBitset::any(&local_b8);
      if (!bVar1) break;
      a = gss::innards::SVOBitset::find_first(&local_b8);
      gss::innards::SVOBitset::reset(&local_140,a);
      gss::innards::SVOBitset::reset(&local_b8,a);
      gss::innards::SVOBitset::intersect_with_complement
                (&local_b8,
                 (this->adj).
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)a);
      p_bounds[*p_end] = iVar2;
      p_order[*p_end] = a;
      *p_end = *p_end + 1;
    }
    gss::innards::SVOBitset::~SVOBitset(&local_b8);
  }
  gss::innards::SVOBitset::~SVOBitset(&local_140);
  return;
}

Assistant:

auto colour_class_order(
            const SVOBitset & p,
            int * p_order,
            int * p_bounds,
            int & p_end) -> void
        {
            SVOBitset p_left = p; // not coloured yet
            unsigned colour = 0;  // current colour
            p_end = 0;

            // while we've things left to colour
            while (p_left.any()) {
                // next colour
                ++colour;
                // things that can still be given this colour
                SVOBitset q = p_left;

                // while we can still give something this colour
                while (q.any()) {
                    // first thing we can colour
                    int v = q.find_first();
                    p_left.reset(v);
                    q.reset(v);

                    // can't give anything adjacent to this the same colour
                    q.intersect_with_complement(adj[v]);

                    // record in result
                    p_bounds[p_end] = colour;
                    p_order[p_end] = v;
                    ++p_end;
                }
            }
        }